

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O3

wstring * __thiscall
lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  wstring res;
  wstring local_48;
  
  puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 == puVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    paVar1 = &local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = L'\0';
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (1 < (ulong)((long)puVar2 - (long)puVar3)) {
      uVar4 = 0;
      do {
        this = (LZString *)
               (ulong)(ushort)(*(ushort *)(puVar3 + uVar4 * 2) << 8 |
                              *(ushort *)(puVar3 + uVar4 * 2) >> 8);
        std::__cxx11::wstring::push_back((wchar_t)&local_48);
        uVar4 = uVar4 + 1;
        puVar3 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(input->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >>
                       1);
    }
    DeCompress(__return_storage_ptr__,this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT44(local_48.field_2._M_local_buf[1],local_48.field_2._M_local_buf[0]) *
                      4 + 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromUint8Array(const std::vector<uint8_t> &input)
{
	if (input.empty())
		return std::wstring();

	std::wstring res;
	for (size_t i = 0; i < input.size() / 2; i++)
	{
		res += (wchar_t)(input[i * 2] * 256 + input[i * 2 + 1]);
	}

	return DeCompress(res);
}